

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_guardedTests.cpp
# Opt level: O2

void __thiscall
rcu_guarded_rcu_guarded_1_Test::rcu_guarded_rcu_guarded_1_Test(rcu_guarded_rcu_guarded_1_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016bf98;
  return;
}

Assistant:

TEST(rcu_guarded, rcu_guarded_1)
{
    rcu_guarded<rcu_list<int>> my_list;

    {
        auto handle = my_list.lock_write();
        handle->push_back(42);
    }

    {
        auto handle = my_list.lock_read();

        int count = 0;
        for (auto item : *handle) {
            ++count;
            EXPECT_EQ(item, 42);
        }
        EXPECT_EQ(count, 1);
    }

    {
        auto readHandle = my_list.lock_read();
        auto writeHandle = my_list.lock_write();

        auto iter = readHandle->begin();

        writeHandle->erase(writeHandle->begin());

        int count = 0;
        for (; iter != readHandle->end(); ++iter) {
            ++count;
            EXPECT_EQ(*iter, 42);
        }
        EXPECT_EQ(count, 1);
    }

    {
        auto handle = my_list.lock_read();

        int count = 0;
        volatile int escape;
        for (int value : *handle) {
            escape = value;
            (void)escape;
            ++count;
        }
        EXPECT_EQ(count, 0);
    }

    {
        constexpr const int num_writers = 8;
        std::atomic<int> t_writers_done{0};

        std::vector<std::thread> threads;
        for (int i = 0; i < num_writers; ++i) {
            threads.emplace_back([&]() {
                while (t_writers_done.load() == 0) {
                    auto rHandle = my_list.lock_write();
                    volatile int escape;
                    // NOLINTNEXTLINE
                    for (auto it = rHandle->begin(); it != rHandle->end();
                         ++it) {
                        escape = *it;
                        (void)escape;
                    }
                }
            });

            threads.emplace_back([&]() {
                int count = 0;
                while (t_writers_done.load() == 0 && count < 1000) {
                    auto writeHandle = my_list.lock_write();
                    volatile int escape;
                    // NOLINTNEXTLINE
                    for (auto it = writeHandle->begin();
                         it != writeHandle->end();
                         ++it) {
                        escape = *it;
                        (void)escape;
                    }
                    for (int ii = 0; ii < 2; ++ii) {
                        writeHandle->emplace_back(ii);
                        writeHandle->emplace_front(ii - 1);
                        writeHandle->push_back(ii + 4);
                        writeHandle->push_front(ii - 7);
                    }
                    ++count;
                }
                ++t_writers_done;
            });
        }

        threads.emplace_back([&]() {
            while (t_writers_done.load() != num_writers) {
                auto writeHandle = my_list.lock_write();
                for (auto iter = writeHandle->begin();
                     iter != writeHandle->end();) {
                    iter = writeHandle->erase(iter);
                }
            }

            // Do one last time now that writers are finished
            auto writeHandle = my_list.lock_write();
            for (auto iter = writeHandle->begin();
                 iter != writeHandle->end();) {
                iter = writeHandle->erase(iter);
            }
        });

        for (auto& thread : threads) {
            thread.join();
        }
    }

    {
        auto handle = my_list.lock_read();

        int count = 0;
        volatile int escape;
        // NOLINTNEXTLINE
        for (auto it = handle->begin(); it != handle->end(); ++it) {
            escape = *it;
            (void)escape;
            ++count;
        }
        EXPECT_EQ(count, 0);
    }
}